

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

Territory __thiscall QTimeZonePrivate::territory(QTimeZonePrivate *this)

{
  undefined1 *puVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  Territory unaff_BP;
  byte bVar5;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  iterator __begin2;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = (this->m_id).d.ptr;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  puVar1 = (undefined1 *)(this->m_id).d.size;
  lVar6 = 0;
  do {
    local_58.m_haystack.m_data = "Asia/Kabul" + *(ushort *)((long)&DAT_005a7604 + lVar6);
    local_58.m_haystack.m_size = -1;
    do {
      lVar2 = local_58.m_haystack.m_size + (ulong)*(ushort *)((long)&DAT_005a7604 + lVar6) + 1;
      local_58.m_haystack.m_size = local_58.m_haystack.m_size + 1;
    } while ("Asia/Kabul"[lVar2] != '\0');
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
    local_58.m_needle.ucs = L' ';
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_98,&local_58);
    bVar5 = local_98[0x18];
    if (local_98[0x18] == true) {
      do {
        if ((undefined1 *)local_98._8_8_ == puVar1) {
          rhs.m_data = pcVar4;
          rhs.m_size = (qsizetype)puVar1;
          lhs.m_data = (char *)local_98._16_8_;
          lhs.m_size = local_98._8_8_;
          bVar3 = QtPrivate::equalStrings(lhs,rhs);
        }
        else {
          bVar3 = false;
        }
        if (bVar3 != false) {
          unaff_BP = *(Territory *)((long)&DAT_005a7602 + lVar6);
          break;
        }
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_98);
        bVar5 = local_98[0x18];
      } while (local_98[0x18] != false);
    }
    if ((bVar5 & 1) != 0) goto LAB_00400d17;
    lVar6 = lVar6 + 6;
  } while (lVar6 != 0x876);
  unaff_BP = AnyCountry;
LAB_00400d17:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return unaff_BP;
}

Assistant:

QLocale::Territory QTimeZonePrivate::territory() const
{
    // Default fall-back mode, use the zoneTable to find Region of known Zones
    const QLatin1StringView sought(m_id.data(), m_id.size());
    for (const ZoneData &data : zoneDataTable) {
        for (QLatin1StringView token : data.ids()) {
            if (token == sought)
                return QLocale::Territory(data.territory);
        }
    }
    return QLocale::AnyTerritory;
}